

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O1

S2Point * S2::S2PointFromExact(S2Point *__return_storage_ptr__,Vector3_xf *xf)

{
  int32 iVar1;
  int extraout_EAX;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  ExactFloat local_90;
  ExactFloat local_80;
  ExactFloat local_70;
  ExactFloat local_60;
  ExactFloat local_50;
  ExactFloat local_40;
  
  ExactFloat::ExactFloat(&local_90,xf->c_);
  dVar4 = ExactFloat::ToDouble(&local_90);
  ExactFloat::ExactFloat(&local_70,xf->c_ + 1);
  dVar5 = ExactFloat::ToDouble(&local_70);
  ExactFloat::ExactFloat(&local_80,xf->c_ + 2);
  dVar6 = ExactFloat::ToDouble(&local_80);
  BN_free((BIGNUM *)local_80.bn_.bn_);
  BN_free((BIGNUM *)local_70.bn_.bn_);
  BN_free((BIGNUM *)local_90.bn_.bn_);
  dVar7 = dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4;
  if (dVar7 <= 0.0) {
    iVar2 = -0xbebc201;
    iVar3 = 0;
    do {
      util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,(int)xf);
      iVar1 = local_90.bn_exp_;
      BN_free((BIGNUM *)local_90.bn_.bn_);
      if (iVar1 < 0x7ffffffd) {
        util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                  ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_90,(int)xf);
        ExactFloat::exp(&local_90,__x);
        BN_free((BIGNUM *)local_90.bn_.bn_);
        if (iVar2 <= extraout_EAX) {
          iVar2 = extraout_EAX;
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    if (iVar2 < -200000000) {
      __return_storage_ptr__->c_[0] = 0.0;
      __return_storage_ptr__->c_[1] = 0.0;
      __return_storage_ptr__->c_[2] = 0.0;
    }
    else {
      ExactFloat::ExactFloat(&local_70,xf->c_);
      ldexp(__x_00,(int)&local_90);
      dVar4 = ExactFloat::ToDouble(&local_90);
      ExactFloat::ExactFloat(&local_40,xf->c_ + 1);
      ldexp(__x_01,(int)&local_80);
      dVar5 = ExactFloat::ToDouble(&local_80);
      ExactFloat::ExactFloat(&local_60,xf->c_ + 2);
      ldexp(__x_02,(int)&local_50);
      dVar6 = ExactFloat::ToDouble(&local_50);
      dVar7 = dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = (double)(~-(ulong)(dVar7 != 0.0) & (ulong)dVar7 |
                      (ulong)(1.0 / dVar7) & -(ulong)(dVar7 != 0.0));
      __return_storage_ptr__->c_[0] = dVar4 * dVar7;
      __return_storage_ptr__->c_[1] = dVar5 * dVar7;
      __return_storage_ptr__->c_[2] = dVar6 * dVar7;
      BN_free((BIGNUM *)local_50.bn_.bn_);
      BN_free((BIGNUM *)local_60.bn_.bn_);
      BN_free((BIGNUM *)local_80.bn_.bn_);
      BN_free((BIGNUM *)local_40.bn_.bn_);
      BN_free((BIGNUM *)local_90.bn_.bn_);
      BN_free((BIGNUM *)local_70.bn_.bn_);
    }
  }
  else {
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar7 = (double)(~-(ulong)(dVar7 != 0.0) & (ulong)dVar7 |
                    (ulong)(1.0 / dVar7) & -(ulong)(dVar7 != 0.0));
    __return_storage_ptr__->c_[0] = dVar4 * dVar7;
    __return_storage_ptr__->c_[1] = dVar5 * dVar7;
    __return_storage_ptr__->c_[2] = dVar6 * dVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

static S2Point S2PointFromExact(const Vector3_xf& xf) {
  // If all components of "x" have absolute value less than about 1e-154,
  // then x.Norm2() is zero in double precision due to underflow.  Therefore
  // we need to scale "x" by an appropriate power of 2 before the conversion.
  S2Point x(xf[0].ToDouble(), xf[1].ToDouble(), xf[2].ToDouble());
  if (x.Norm2() > 0) return x.Normalize();

  // Scale so that the largest component magnitude is in the range [0.5, 1).
  int exp = ExactFloat::kMinExp - 1;
  for (int i = 0; i < 3; ++i) {
    if (xf[i].is_normal()) exp = std::max(exp, xf[i].exp());
  }
  if (exp < ExactFloat::kMinExp) {
    return S2Point(0, 0, 0);
  }
  return S2Point(ldexp(xf[0], -exp).ToDouble(),
                 ldexp(xf[1], -exp).ToDouble(),
                 ldexp(xf[2], -exp).ToDouble()).Normalize();
}